

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::PoolingLayerParams(PoolingLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PoolingLayerParams_003961f8;
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  (this->kernelsize_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->kernelsize_).current_size_ = 0;
  (this->kernelsize_).total_size_ = 0;
  if (this != (PoolingLayerParams *)&_PoolingLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->avgpoolexcludepadding_ = false;
  this->globalpooling_ = false;
  this->type_ = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

PoolingLayerParams::PoolingLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.PoolingLayerParams)
}